

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gc.cpp
# Opt level: O0

void __thiscall Gc_SpawnTwo_Test::TestBody(Gc_SpawnTwo_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  int in_EDX;
  int count;
  type local_1c8;
  thread local_1c0;
  thread thread;
  test_watch_thread gc;
  undefined1 local_60 [8];
  spawn_params call1;
  spawn_params call0;
  Gc_SpawnTwo_Test *this_local;
  
  (anonymous_namespace)::Gc::call_params_abi_cxx11_
            ((spawn_params *)
             ((long)&call1.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl.field_2 + 8),(Gc *)0x0,in_EDX);
  (anonymous_namespace)::Gc::call_params_abi_cxx11_((spawn_params *)local_60,(Gc *)0x1,count);
  anon_unknown.dwarf_44f6e::test_watch_thread::test_watch_thread((test_watch_thread *)&thread);
  anon_unknown.dwarf_44f6e::Gc::expect_call
            ((test_watch_thread *)&thread,
             (spawn_params *)
             ((long)&call1.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl.field_2 + 8));
  anon_unknown.dwarf_44f6e::Gc::expect_call((test_watch_thread *)&thread,(spawn_params *)local_60);
  local_1c8.gc = (test_watch_thread *)&thread;
  std::thread::thread<Gc_SpawnTwo_Test::TestBody()::__0,,void>(&local_1c0,&local_1c8);
  pbVar1 = std::get<std::__cxx11::string,std::__cxx11::string,int>
                     ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                       *)((long)&call1.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                 ._M_head_impl.field_2 + 8));
  pstore::broker::gc_watch_thread::start_vacuum((gc_watch_thread *)&thread,pbVar1);
  pbVar1 = std::get<std::__cxx11::string,std::__cxx11::string,int>
                     ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                       *)local_60);
  pstore::broker::gc_watch_thread::start_vacuum((gc_watch_thread *)&thread,pbVar1);
  pbVar1 = std::get<std::__cxx11::string,std::__cxx11::string,int>
                     ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                       *)((long)&call1.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                 ._M_head_impl.field_2 + 8));
  pstore::broker::gc_watch_thread::start_vacuum((gc_watch_thread *)&thread,pbVar1);
  pbVar1 = std::get<std::__cxx11::string,std::__cxx11::string,int>
                     ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                       *)local_60);
  pstore::broker::gc_watch_thread::start_vacuum((gc_watch_thread *)&thread,pbVar1);
  pstore::broker::gc_watch_thread::stop((gc_watch_thread *)&thread,-1);
  std::thread::join();
  std::thread::~thread(&local_1c0);
  anon_unknown.dwarf_44f6e::test_watch_thread::~test_watch_thread((test_watch_thread *)&thread);
  std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          *)local_60);
  std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          *)((long)&call1.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl.field_2 + 8));
  return;
}

Assistant:

TEST_F (Gc, SpawnTwo) {
    auto call0 = call_params (0);
    auto call1 = call_params (1);

    test_watch_thread gc;
    expect_call (gc, call0);
    expect_call (gc, call1);

    std::thread thread{[&gc] () { gc.watcher (); }};

    gc.start_vacuum (std::get<std::string> (call0));
    gc.start_vacuum (std::get<std::string> (call1));
    gc.start_vacuum (std::get<std::string> (call0));
    gc.start_vacuum (std::get<std::string> (call1));

    gc.stop ();
    thread.join ();
}